

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O2

void __thiscall
Imf_3_4::ChannelList::channelsInLayer
          (ChannelList *this,string *layerName,Iterator *first,Iterator *last)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,layerName,'.');
  channelsWithPrefix(this,local_40._M_dataplus._M_p,first,last);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void
ChannelList::channelsInLayer (
    const string& layerName, Iterator& first, Iterator& last)
{
    channelsWithPrefix (layerName + '.', first, last);
}